

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy.hpp
# Opt level: O0

size_t io::
       copy<io::basic_string_stream<char,std::char_traits<char>>&,io::basic_string_stream<char,std::char_traits<char>>&,void>
                 (basic_string_stream<char,_std::char_traits<char>_> *src,
                 basic_string_stream<char,_std::char_traits<char>_> *dest)

{
  bool bVar1;
  size_t sVar2;
  system_error *this;
  error_code __ec;
  size_t bytes_copied;
  error_code ec;
  basic_string_stream<char,_std::char_traits<char>_> *dest_local;
  basic_string_stream<char,_std::char_traits<char>_> *src_local;
  
  ec._M_cat = (error_category *)dest;
  std::error_code::error_code((error_code *)&bytes_copied);
  sVar2 = copy<io::basic_string_stream<char,std::char_traits<char>>&,io::basic_string_stream<char,std::char_traits<char>>&,void>
                    (src,(basic_string_stream<char,_std::char_traits<char>_> *)ec._M_cat,
                     (error_code *)&bytes_copied);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)&bytes_copied);
  if (!bVar1) {
    return sVar2;
  }
  this = (system_error *)__cxa_allocate_exception(0x20);
  __ec._0_8_ = bytes_copied & 0xffffffff;
  __ec._M_cat = (error_category *)ec._0_8_;
  std::system_error::system_error(this,__ec);
  __cxa_throw(this,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

std::size_t copy(ReadStream&& src, WriteStream&& dest)
{
    std::error_code ec;
    std::size_t bytes_copied = io::copy(std::forward<ReadStream>(src),
                                        std::forward<WriteStream>(dest),
                                        ec);
    if (ec) {
        throw std::system_error{ec};
    }
    return bytes_copied;
}